

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

xmlRelaxNGValidStatePtr xmlRelaxNGNewValidState(xmlRelaxNGValidCtxtPtr ctxt,xmlNodePtr node)

{
  xmlRelaxNGStatesPtr pxVar1;
  xmlNodePtr pxVar2;
  xmlRelaxNGValidStatePtr pxVar3;
  xmlDocPtr pxVar4;
  xmlAttrPtr *__dest;
  _xmlAttr *p_Var5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  xmlAttrPtr attrs [20];
  long local_c8 [20];
  
  if (node == (xmlNodePtr)0x0) {
    pxVar2 = xmlDocGetRootElement(ctxt->doc);
    uVar9 = 0;
    if (pxVar2 == (xmlNodePtr)0x0) {
      return (xmlRelaxNGValidStatePtr)0x0;
    }
  }
  else {
    uVar9 = 0;
    for (p_Var5 = node->properties; p_Var5 != (_xmlAttr *)0x0; p_Var5 = p_Var5->next) {
      if (uVar9 < 0x14) {
        local_c8[uVar9] = (long)p_Var5;
      }
      uVar9 = uVar9 + 1;
    }
    pxVar2 = (xmlNodePtr)0x0;
  }
  uVar8 = (uint)uVar9;
  pxVar1 = ctxt->freeState;
  if ((pxVar1 == (xmlRelaxNGStatesPtr)0x0) || (pxVar1->nbState < 1)) {
    pxVar3 = (xmlRelaxNGValidStatePtr)(*xmlMalloc)(0x38);
    if (pxVar3 == (xmlRelaxNGValidStatePtr)0x0) {
      xmlRngVErrMemory(ctxt);
      return (xmlRelaxNGValidStatePtr)0x0;
    }
    pxVar3->value = (xmlChar *)0x0;
    pxVar3->endvalue = (xmlChar *)0x0;
    pxVar3->nbAttrs = 0;
    pxVar3->maxAttrs = 0;
    *(undefined8 *)&pxVar3->nbAttrLeft = 0;
    pxVar3->node = (xmlNodePtr)0x0;
    pxVar3->seq = (xmlNodePtr)0x0;
    pxVar3->attrs = (xmlAttrPtr *)0x0;
  }
  else {
    uVar6 = pxVar1->nbState - 1;
    pxVar1->nbState = uVar6;
    pxVar3 = pxVar1->tabState[uVar6];
  }
  pxVar3->value = (xmlChar *)0x0;
  pxVar3->endvalue = (xmlChar *)0x0;
  if (node == (xmlNodePtr)0x0) {
    pxVar4 = ctxt->doc;
  }
  else {
    pxVar2 = node->children;
    pxVar4 = (xmlDocPtr)node;
  }
  pxVar3->node = (xmlNodePtr)pxVar4;
  pxVar3->seq = pxVar2;
  pxVar3->nbAttrs = 0;
  if (uVar8 == 0) {
    uVar8 = 0;
  }
  else {
    __dest = pxVar3->attrs;
    if (__dest == (xmlAttrPtr *)0x0) {
      uVar6 = 4;
      if (4 < uVar8) {
        uVar6 = uVar8;
      }
      pxVar3->maxAttrs = uVar6;
      __dest = (xmlAttrPtr *)(*xmlMalloc)((long)(int)uVar6 << 3);
      pxVar3->attrs = __dest;
      if (__dest == (xmlAttrPtr *)0x0) {
LAB_00180dfa:
        xmlRngVErrMemory(ctxt);
        return pxVar3;
      }
    }
    else if (pxVar3->maxAttrs < (int)uVar8) {
      __dest = (xmlAttrPtr *)(*xmlRealloc)(__dest,(uVar9 & 0xffffffff) << 3);
      if (__dest == (xmlAttrPtr *)0x0) goto LAB_00180dfa;
      pxVar3->attrs = __dest;
      pxVar3->maxAttrs = uVar8;
    }
    pxVar3->nbAttrs = uVar8;
    if (uVar8 < 0x14) {
      memcpy(__dest,local_c8,(ulong)(uVar8 << 3));
      uVar8 = pxVar3->nbAttrs;
    }
    else {
      p_Var5 = node->properties;
      if (p_Var5 != (_xmlAttr *)0x0) {
        lVar7 = 0;
        do {
          *(_xmlAttr **)((long)pxVar3->attrs + lVar7) = p_Var5;
          p_Var5 = p_Var5->next;
          lVar7 = lVar7 + 8;
        } while (p_Var5 != (_xmlAttr *)0x0);
      }
    }
  }
  pxVar3->nbAttrLeft = uVar8;
  return pxVar3;
}

Assistant:

static xmlRelaxNGValidStatePtr
xmlRelaxNGNewValidState(xmlRelaxNGValidCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGValidStatePtr ret;
    xmlAttrPtr attr;
    xmlAttrPtr attrs[MAX_ATTR];
    int nbAttrs = 0;
    xmlNodePtr root = NULL;

    if (node == NULL) {
        root = xmlDocGetRootElement(ctxt->doc);
        if (root == NULL)
            return (NULL);
    } else {
        attr = node->properties;
        while (attr != NULL) {
            if (nbAttrs < MAX_ATTR)
                attrs[nbAttrs++] = attr;
            else
                nbAttrs++;
            attr = attr->next;
        }
    }
    if ((ctxt->freeState != NULL) && (ctxt->freeState->nbState > 0)) {
        ctxt->freeState->nbState--;
        ret = ctxt->freeState->tabState[ctxt->freeState->nbState];
    } else {
        ret =
            (xmlRelaxNGValidStatePtr)
            xmlMalloc(sizeof(xmlRelaxNGValidState));
        if (ret == NULL) {
            xmlRngVErrMemory(ctxt);
            return (NULL);
        }
        memset(ret, 0, sizeof(xmlRelaxNGValidState));
    }
    ret->value = NULL;
    ret->endvalue = NULL;
    if (node == NULL) {
        ret->node = (xmlNodePtr) ctxt->doc;
        ret->seq = root;
    } else {
        ret->node = node;
        ret->seq = node->children;
    }
    ret->nbAttrs = 0;
    if (nbAttrs > 0) {
        if (ret->attrs == NULL) {
            if (nbAttrs < 4)
                ret->maxAttrs = 4;
            else
                ret->maxAttrs = nbAttrs;
            ret->attrs = (xmlAttrPtr *) xmlMalloc(ret->maxAttrs *
                                                  sizeof(xmlAttrPtr));
            if (ret->attrs == NULL) {
                xmlRngVErrMemory(ctxt);
                return (ret);
            }
        } else if (ret->maxAttrs < nbAttrs) {
            xmlAttrPtr *tmp;

            tmp = (xmlAttrPtr *) xmlRealloc(ret->attrs, nbAttrs *
                                            sizeof(xmlAttrPtr));
            if (tmp == NULL) {
                xmlRngVErrMemory(ctxt);
                return (ret);
            }
            ret->attrs = tmp;
            ret->maxAttrs = nbAttrs;
        }
        ret->nbAttrs = nbAttrs;
        if (nbAttrs < MAX_ATTR) {
            memcpy(ret->attrs, attrs, sizeof(xmlAttrPtr) * nbAttrs);
        } else {
            attr = node->properties;
            nbAttrs = 0;
            while (attr != NULL) {
                ret->attrs[nbAttrs++] = attr;
                attr = attr->next;
            }
        }
    }
    ret->nbAttrLeft = ret->nbAttrs;
    return (ret);
}